

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O3

void __thiscall
kratos::VarDuplicated::add_source(VarDuplicated *this,shared_ptr<kratos::AssignStmt> *stmt)

{
  StmtException *this_00;
  initializer_list<kratos::IRNode_*> __l;
  element_type *local_68;
  vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> local_60;
  string local_48;
  allocator_type local_21;
  
  this_00 = (StmtException *)__cxa_allocate_exception(0x10);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"Duplicate variable cannot be on left hand side","");
  local_68 = (stmt->super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  __l._M_len = 1;
  __l._M_array = (iterator)&local_68;
  std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector(&local_60,__l,&local_21);
  StmtException::StmtException(this_00,&local_48,&local_60);
  __cxa_throw(this_00,&StmtException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void VarDuplicated::add_source(const std::shared_ptr<AssignStmt> &stmt) {
    throw StmtException("Duplicate variable cannot be on left hand side", {stmt.get()});
}